

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O2

int32_t ucptrie_toBinary_63(UCPTrie *trie,void *data,int32_t capacity,UErrorCode *pErrorCode)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int32_t iVar4;
  size_t __n;
  int iVar5;
  void *__src;
  uint uVar6;
  
  iVar5 = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((capacity < 0) || (bVar1 = trie->type, 1 < bVar1)) ||
        (bVar2 = trie->valueWidth, 2 < bVar2)) ||
       ((capacity != 0 && (data == (void *)0x0 || ((ulong)data & 3) != 0)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      iVar5 = 0;
    }
    else {
      iVar3 = trie->indexLength;
      iVar5 = (int)((long)iVar3 * 2) + 0x10;
      if (bVar2 == 2) {
        uVar6 = trie->dataLength;
        iVar5 = iVar5 + uVar6;
      }
      else if (bVar2 == 1) {
        uVar6 = trie->dataLength;
        iVar5 = iVar5 + uVar6 * 4;
      }
      else {
        uVar6 = trie->dataLength;
        iVar5 = (uVar6 + iVar3) * 2 + 0x10;
      }
      if (capacity < iVar5) {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        *(undefined4 *)data = 0x54726933;
        iVar4 = trie->dataNullOffset;
        *(ushort *)((long)data + 4) =
             (ushort)(byte)(bVar2 | bVar1 << 6) | (ushort)(uVar6 >> 4) & 0xf000 |
             (ushort)((uint)iVar4 >> 8) & 0xf00;
        *(short *)((long)data + 6) = (short)iVar3;
        *(short *)((long)data + 8) = (short)uVar6;
        *(uint16_t *)((long)data + 10) = trie->index3NullOffset;
        *(short *)((long)data + 0xc) = (short)iVar4;
        *(short *)((long)data + 0xe) = (short)((uint)trie->highStart >> 9);
        memcpy((void *)((long)data + 0x10),trie->index,(long)iVar3 * 2);
        if (bVar2 == 2) {
          __src = (trie->data).ptr0;
          __n = (size_t)trie->dataLength;
        }
        else if (bVar2 == 1) {
          __src = (trie->data).ptr0;
          __n = (long)trie->dataLength << 2;
        }
        else {
          __src = (trie->data).ptr0;
          __n = (long)trie->dataLength * 2;
        }
        memcpy((void *)((long)data + (long)trie->indexLength * 2 + 0x10),__src,__n);
      }
    }
  }
  return iVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucptrie_toBinary(const UCPTrie *trie,
                 void *data, int32_t capacity,
                 UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) {
        return 0;
    }

    UCPTrieType type = (UCPTrieType)trie->type;
    UCPTrieValueWidth valueWidth = (UCPTrieValueWidth)trie->valueWidth;
    if (type < UCPTRIE_TYPE_FAST || UCPTRIE_TYPE_SMALL < type ||
            valueWidth < UCPTRIE_VALUE_BITS_16 || UCPTRIE_VALUE_BITS_8 < valueWidth ||
            capacity < 0 ||
            (capacity > 0 && (data == nullptr || (U_POINTER_MASK_LSB(data, 3) != 0)))) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    int32_t length = (int32_t)sizeof(UCPTrieHeader) + trie->indexLength * 2;
    switch (valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        length += trie->dataLength * 2;
        break;
    case UCPTRIE_VALUE_BITS_32:
        length += trie->dataLength * 4;
        break;
    case UCPTRIE_VALUE_BITS_8:
        length += trie->dataLength;
        break;
    default:
        // unreachable
        break;
    }
    if (capacity < length) {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
        return length;
    }

    char *bytes = (char *)data;
    UCPTrieHeader *header = (UCPTrieHeader *)bytes;
    header->signature = UCPTRIE_SIG;  // "Tri3"
    header->options = (uint16_t)(
        ((trie->dataLength & 0xf0000) >> 4) |
        ((trie->dataNullOffset & 0xf0000) >> 8) |
        (trie->type << 6) |
        valueWidth);
    header->indexLength = (uint16_t)trie->indexLength;
    header->dataLength = (uint16_t)trie->dataLength;
    header->index3NullOffset = trie->index3NullOffset;
    header->dataNullOffset = (uint16_t)trie->dataNullOffset;
    header->shiftedHighStart = trie->highStart >> UCPTRIE_SHIFT_2;
    bytes += sizeof(UCPTrieHeader);

    uprv_memcpy(bytes, trie->index, trie->indexLength * 2);
    bytes += trie->indexLength * 2;

    switch (valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        uprv_memcpy(bytes, trie->data.ptr16, trie->dataLength * 2);
        break;
    case UCPTRIE_VALUE_BITS_32:
        uprv_memcpy(bytes, trie->data.ptr32, trie->dataLength * 4);
        break;
    case UCPTRIE_VALUE_BITS_8:
        uprv_memcpy(bytes, trie->data.ptr8, trie->dataLength);
        break;
    default:
        // unreachable
        break;
    }
    return length;
}